

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetArcExtent.cpp
# Opt level: O1

double GeoCalcs::GetArcExtent(double dStartCrs,double dEndCrs,int nOrientation,double dTol)

{
  double dVar1;
  
  if (dTol <= ABS(dStartCrs - dEndCrs)) {
    dVar1 = dStartCrs;
    if (nOrientation >= 0) {
      dVar1 = dEndCrs;
      dEndCrs = dStartCrs;
    }
    dVar1 = (double)(~-(ulong)(dVar1 < dEndCrs) & (ulong)(dEndCrs + 6.283185307179586) |
                    (ulong)dEndCrs & -(ulong)(dVar1 < dEndCrs)) - dVar1;
    if (nOrientation < 0) {
      dVar1 = -dVar1;
    }
    return dVar1;
  }
  return 6.283185307179586;
}

Assistant:

double GetArcExtent(double dStartCrs, double dEndCrs, const int nOrientation, double dTol)
    {
        if (fabs(dStartCrs - dEndCrs) < dTol)
            return M_2PI;

        if (nOrientation < 0)
        {
            std::swap(dStartCrs, dEndCrs);
        }

        double dAngle = dStartCrs > dEndCrs ? dStartCrs - dEndCrs : M_2PI + dStartCrs - dEndCrs;

        if (nOrientation < 0)
            dAngle = -dAngle;

        return dAngle;
    }